

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Print
          (TextGenerator *this,char *text,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  if (size == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    sVar2 = 1;
    do {
      if (text[sVar2 - 1] == '\n') {
        Write(this,text + sVar1,sVar2 - sVar1);
        this->at_start_of_line_ = true;
        sVar1 = sVar2;
      }
      bVar3 = sVar2 != size;
      sVar2 = sVar2 + 1;
    } while (bVar3);
  }
  Write(this,text + sVar1,size - sVar1);
  return;
}

Assistant:

void Print(const char* text, size_t size) {
    size_t pos = 0;  // The number of bytes we've written so far.

    for (size_t i = 0; i < size; i++) {
      if (text[i] == '\n') {
        // Saw newline.  If there is more text, we may need to insert an indent
        // here.  So, write what we have so far, including the '\n'.
        Write(text + pos, i - pos + 1);
        pos = i + 1;

        // Setting this true will cause the next Write() to insert an indent
        // first.
        at_start_of_line_ = true;
      }
    }

    // Write the rest.
    Write(text + pos, size - pos);
  }